

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::ArrayFeatureType::SharedDtor(ArrayFeatureType *this)

{
  if (this->_oneof_case_[0] != 0) {
    clear_ShapeFlexibility(this);
  }
  if (this->_oneof_case_[1] != 0) {
    this->_oneof_case_[1] = 0;
  }
  return;
}

Assistant:

void ArrayFeatureType::SharedDtor() {
  if (has_ShapeFlexibility()) {
    clear_ShapeFlexibility();
  }
  if (has_defaultOptionalValue()) {
    clear_defaultOptionalValue();
  }
}